

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

char * fmt::v9::detail::
       parse_precision<char,fmt::v9::detail::specs_checker<fmt::v9::detail::specs_handler<char>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v9::detail::specs_handler<char>_> *handler)

{
  char cVar1;
  char *pcVar2;
  char local_61;
  precision_adapter local_60;
  int local_58;
  char local_51;
  int precision;
  char c;
  specs_checker<fmt::v9::detail::specs_handler<char>_> *handler_local;
  char *end_local;
  char *begin_local;
  char local_29;
  precision_adapter *ppStack_28;
  char c_1;
  char *local_20;
  char *local_18;
  char *local_10;
  
  end_local = begin + 1;
  if (end_local == end) {
    local_61 = '\0';
  }
  else {
    local_61 = *end_local;
  }
  local_51 = local_61;
  _precision = handler;
  handler_local = (specs_checker<fmt::v9::detail::specs_handler<char>_> *)end;
  if ((local_61 < '0') || ('9' < local_61)) {
    if (local_61 != '{') {
      specs_handler<char>::on_error
                (&handler->super_specs_handler<char>,"missing precision specifier");
      return end_local;
    }
    end_local = begin + 2;
    if (end_local != end) {
      ppStack_28 = &local_60;
      local_29 = *end_local;
      local_60.handler = handler;
      local_20 = end;
      local_18 = end_local;
      if ((local_29 == '}') || (local_29 == ':')) {
        parse_precision<char,_fmt::v9::detail::specs_checker<fmt::v9::detail::specs_handler<char>_>_&>
        ::precision_adapter::operator()(ppStack_28);
        local_10 = local_18;
      }
      else {
        local_10 = do_parse_arg_id<char,fmt::v9::detail::parse_precision<char,fmt::v9::detail::specs_checker<fmt::v9::detail::specs_handler<char>>&>(char_const*,char_const*,fmt::v9::detail::specs_checker<fmt::v9::detail::specs_handler<char>>&)::precision_adapter&>
                             (end_local,end,ppStack_28);
      }
      end_local = local_10;
    }
    if (((specs_checker<fmt::v9::detail::specs_handler<char>_> *)end_local == handler_local) ||
       (pcVar2 = end_local + 1, cVar1 = *end_local, end_local = pcVar2, cVar1 != '}')) {
      specs_handler<char>::on_error(&_precision->super_specs_handler<char>,"invalid format string");
      return end_local;
    }
  }
  else {
    local_58 = parse_nonnegative_int<char>(&end_local,end,-1);
    if (local_58 == -1) {
      specs_handler<char>::on_error(&_precision->super_specs_handler<char>,"number is too big");
    }
    else {
      specs_setter<char>::on_precision((specs_setter<char> *)_precision,local_58);
    }
  }
  specs_checker<fmt::v9::detail::specs_handler<char>_>::end_precision(_precision);
  return end_local;
}

Assistant:

FMT_CONSTEXPR auto parse_precision(const Char* begin, const Char* end,
                                   Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct precision_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_precision(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_precision(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_precision(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    auto precision = parse_nonnegative_int(begin, end, -1);
    if (precision != -1)
      handler.on_precision(precision);
    else
      handler.on_error("number is too big");
  } else if (c == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, precision_adapter{handler});
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}